

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O0

int Bmc_CollapseIrredundant(Vec_Str_t *vSop,int nCubes,int nVars)

{
  int iVar1;
  Vec_Int_t *p;
  Vec_Ptr_t *p_00;
  sat_solver *s;
  void *pvVar2;
  int *piVar3;
  int *piVar4;
  int local_64;
  int j;
  Vec_Ptr_t *vCubes;
  char *pSop;
  char *pCube;
  Vec_Int_t *vLits;
  int nRemoved;
  int iLit;
  int status;
  int k;
  int i;
  sat_solver *pSat;
  int nBTLimit;
  int nVars_local;
  int nCubes_local;
  Vec_Str_t *vSop_local;
  
  vLits._4_4_ = 0;
  p = Vec_IntAlloc(nVars);
  pSop = Vec_StrArray(vSop);
  p_00 = Vec_PtrAlloc(nCubes);
  iVar1 = Vec_StrSize(vSop);
  if (iVar1 != nCubes * (nVars + 3) + 1) {
    __assert_fail("Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcClp.c"
                  ,0xd5,"int Bmc_CollapseIrredundant(Vec_Str_t *, int, int)");
  }
  for (; *pSop != '\0'; pSop = pSop + (nVars + 3)) {
    Vec_PtrPush(p_00,pSop);
  }
  s = sat_solver_new();
  sat_solver_setnvars(s,nVars);
  status = Vec_PtrSize(p_00);
  while (status = status + -1, -1 < status) {
    pvVar2 = Vec_PtrEntry(p_00,status);
    Vec_IntClear(p);
    for (iLit = 0; iLit < nVars; iLit = iLit + 1) {
      if (*(char *)((long)pvVar2 + (long)iLit) != '-') {
        iVar1 = Abc_Var2Lit(iLit,(uint)(*(char *)((long)pvVar2 + (long)iLit) == '1'));
        Vec_IntPush(p,iVar1);
      }
    }
    piVar3 = Vec_IntArray(p);
    piVar4 = Vec_IntLimit(p);
    iVar1 = sat_solver_solve(s,piVar3,piVar4,0,0,0,0);
    if (iVar1 == 0) break;
    if (iVar1 == -1) {
      Vec_PtrWriteEntry(p_00,status,(void *)0x0);
      vLits._4_4_ = vLits._4_4_ + 1;
    }
    else {
      if (iVar1 != 1) {
        __assert_fail("status == l_True",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcClp.c"
                      ,0xef,"int Bmc_CollapseIrredundant(Vec_Str_t *, int, int)");
      }
      for (iLit = 0; iVar1 = Vec_IntSize(p), iLit < iVar1; iLit = iLit + 1) {
        iVar1 = Vec_IntEntry(p,iLit);
        iVar1 = Abc_LitNot(iVar1);
        Vec_IntWriteEntry(p,iLit,iVar1);
      }
      piVar3 = Vec_IntArray(p);
      piVar4 = Vec_IntLimit(p);
      iVar1 = sat_solver_addclause(s,piVar3,piVar4);
      if (iVar1 != 1) {
        __assert_fail("status == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcClp.c"
                      ,0xf5,"int Bmc_CollapseIrredundant(Vec_Str_t *, int, int)");
      }
    }
  }
  if ((status == -1) && (0 < vLits._4_4_)) {
    local_64 = 0;
    for (status = 0; iVar1 = Vec_PtrSize(p_00), status < iVar1; status = status + 1) {
      pvVar2 = Vec_PtrEntry(p_00,status);
      if (pvVar2 != (void *)0x0) {
        for (iLit = 0; iLit < nVars + 3; iLit = iLit + 1) {
          Vec_StrWriteEntry(vSop,local_64,*(char *)((long)pvVar2 + (long)iLit));
          local_64 = local_64 + 1;
        }
      }
    }
    Vec_StrWriteEntry(vSop,local_64,'\0');
    Vec_StrShrink(vSop,local_64 + 1);
  }
  sat_solver_delete(s);
  Vec_PtrFree(p_00);
  Vec_IntFree(p);
  return (uint)(status == -1);
}

Assistant:

int Bmc_CollapseIrredundant( Vec_Str_t * vSop, int nCubes, int nVars )
{
    int nBTLimit = 0;
    sat_solver * pSat; 
    int i, k, status, iLit, nRemoved = 0; 
    Vec_Int_t * vLits = Vec_IntAlloc(nVars);
    // collect cubes
    char * pCube, * pSop = Vec_StrArray(vSop);
    Vec_Ptr_t * vCubes = Vec_PtrAlloc(nCubes);
    assert( Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1 );
    Bmc_SopForEachCube( pSop, nVars, pCube )
        Vec_PtrPush( vCubes, pCube );
    // create SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, nVars );
    // iterate through cubes in the reverse order
    Vec_PtrForEachEntryReverse( char *, vCubes, pCube, i )
    {
        // collect literals
        Vec_IntClear( vLits );
        for ( k = 0; k < nVars; k++ )
            if ( pCube[k] != '-' )
                Vec_IntPush( vLits, Abc_Var2Lit(k, pCube[k] == '1') );
        // check if this cube intersects with the complement of other cubes in the solver
        // if it does not intersect, then it is redundant and can be skipped
        // if it does, then it should be added
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
        if ( status == l_Undef ) // timeout
            break;
        if ( status == l_False ) // unsat
        {
            Vec_PtrWriteEntry( vCubes, i, NULL );
            nRemoved++;
            continue;
        }
        assert( status == l_True );
        // make a clause out of the cube by complementing its literals
        Vec_IntForEachEntry( vLits, iLit, k )
            Vec_IntWriteEntry( vLits, k, Abc_LitNot(iLit) );
        // add it to the solver
        status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) );
        assert( status == 1 );
    }
    //printf( "Approximate irrendundant reduced %d cubes (out of %d).\n", nRemoved, nCubes );
    // cleanup cover
    if ( i == -1 && nRemoved > 0 ) // finished without timeout and removed some cubes
    {
        int j = 0;
        Vec_PtrForEachEntry( char *, vCubes, pCube, i )
            if ( pCube != NULL )
                for ( k = 0; k < nVars + 3; k++ )
                    Vec_StrWriteEntry( vSop, j++, pCube[k] );
        Vec_StrWriteEntry( vSop, j++, '\0' );
        Vec_StrShrink( vSop, j );
    }
    sat_solver_delete( pSat );
    Vec_PtrFree( vCubes );
    Vec_IntFree( vLits );
    return i == -1 ? 1 : 0;
}